

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ms.c
# Opt level: O0

void bp_update_ms(mod2sparse *H,char *synd,double *log_prob_ratios,int iter,char *decoding)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int in_ECX;
  undefined1 in_DL;
  undefined7 in_register_00000011;
  long in_RSI;
  int *in_RDI;
  long in_R8;
  double dVar4;
  double dVar5;
  char *temp_dec;
  char *temp_synd;
  double alpha;
  double min2;
  double min1;
  int synd_sgn;
  int mod2row_weight;
  double sgn;
  int j;
  int i;
  int M;
  int N;
  mod2entry *e;
  double dX;
  double nX;
  double dR;
  double pr;
  double local_80;
  double local_78;
  uint local_6c;
  double local_68;
  int local_60;
  int local_5c;
  int *local_50;
  double local_30;
  
  iVar1 = *in_RDI;
  iVar2 = in_RDI[1];
  dVar4 = pow(2.0,((double)(in_ECX + 1) * -1.0) / 1.0);
  for (local_5c = 0; local_5c < iVar1; local_5c = local_5c + 1) {
    if (*(char *)(in_RSI + local_5c) == '\0') {
      local_6c = 0;
    }
    else {
      local_6c = (uint)(*(char *)(in_RSI + local_5c) == '\x01');
    }
    local_78 = 1e+308;
    local_80 = 1e+308;
    for (local_50 = *(int **)(*(long *)(in_RDI + 2) + (long)local_5c * 0x38 + 0x10); -1 < *local_50;
        local_50 = *(int **)(local_50 + 4)) {
      uVar3 = (ulong)DAT_00176b50;
      if (local_78 <= ABS(*(double *)(local_50 + 10))) {
        if ((double)(*(ulong *)(local_50 + 10) & uVar3) < local_80) {
          local_80 = (double)(*(ulong *)(local_50 + 10) & uVar3);
        }
      }
      else {
        local_80 = local_78;
        local_78 = (double)(*(ulong *)(local_50 + 10) & uVar3);
      }
      if (*(double *)(local_50 + 10) <= 0.0) {
        local_6c = local_6c + 1;
      }
    }
    for (local_50 = *(int **)(*(long *)(in_RDI + 2) + (long)local_5c * 0x38 + 8); -1 < *local_50;
        local_50 = *(int **)(local_50 + 2)) {
      if (0.0 < *(double *)(local_50 + 10)) {
        local_68 = (double)(int)local_6c;
      }
      else {
        local_68 = local_68 + (double)(int)local_6c;
      }
      local_68 = pow(-1.0,local_68);
      dVar5 = (double)(*(ulong *)(local_50 + 10) & (ulong)DAT_00176b50);
      if ((dVar5 != local_78) || (NAN(dVar5) || NAN(local_78))) {
        *(double *)(local_50 + 0xc) = (1.0 - dVar4) * local_68 * local_78;
      }
      else {
        *(double *)(local_50 + 0xc) = (1.0 - dVar4) * local_68 * local_80;
      }
    }
  }
  for (local_60 = 0; local_60 < iVar2; local_60 = local_60 + 1) {
    local_30 = log_prob_ratio_initial;
    for (local_50 = *(int **)(*(long *)(in_RDI + 4) + (long)local_60 * 0x38 + 0x20); -1 < *local_50;
        local_50 = *(int **)(local_50 + 8)) {
      local_30 = *(double *)(local_50 + 0xc) + local_30;
    }
    *(double *)(CONCAT71(in_register_00000011,in_DL) + (long)local_60 * 8) = local_30;
    *(bool *)(in_R8 + local_60) = local_30 <= 0.0;
    for (local_50 = *(int **)(*(long *)(in_RDI + 4) + (long)local_60 * 0x38 + 0x18); -1 < *local_50;
        local_50 = *(int **)(local_50 + 6)) {
      *(double *)(local_50 + 10) = local_30 - *(double *)(local_50 + 0xc);
    }
  }
  return;
}

Assistant:

void bp_update_ms(mod2sparse *H,
    char *synd,
    double *log_prob_ratios,
    int iter,
    char *decoding)
    {

  double pr, dR,nX,dX;
  mod2entry *e;
  int N, M;
  int i, j;
  double sgn;
  int mod2row_weight;
  int synd_sgn;
  double min1, min2;
  double alpha;


  M = mod2sparse_rows(H);
  N = mod2sparse_cols(H);

  char *temp_synd;
  char *temp_dec;

  //scaling factor
  iter++;
  alpha=1.0 - pow(2.0,  (-1*(double) iter)/1  );


  //Recompute likelihood ratios.
  for (i = 0; i<M; i++)
  { 
    
    mod2row_weight=0;
    if(synd[i]==0)
      { 
        mod2row_weight=0;
      }
    else if(synd[i]==1)
      { 
        mod2row_weight=1;
      }

    min1=1e308;
    min2=1e308;

    for (e = mod2sparse_first_in_row(H,i);
         !mod2sparse_at_end(e);
         e = mod2sparse_next_in_row(e))
      { 
        if (fabs(e->pr) < min1)
            {
                min2=min1;
                min1=fabs(e->pr);
            }
        else if(fabs(e->pr) < min2)
            {
                min2=fabs(e->pr);
            }
        
        if(e->pr <= 0) mod2row_weight++;
      }

    for (e = mod2sparse_last_in_row(H,i);
         !mod2sparse_at_end(e);
         e = mod2sparse_prev_in_row(e))
      {
        if(e->pr <= 0) sgn=sgn+ mod2row_weight;
        else sgn=mod2row_weight;

        sgn=pow(-1,sgn);
        if (fabs(e->pr)==min1) e->lr=alpha*sgn*min2;
        else e->lr=alpha*sgn*min1;

      }

  }

  //Recompute log-probability-ratios for the bits
  for (j = 0; j<N; j++)
    { 
      pr = log_prob_ratio_initial;
      for (e = mod2sparse_first_in_col(H,j);
          !mod2sparse_at_end(e);
          e = mod2sparse_next_in_col(e))
        {
          pr+=e->lr;
        }
      log_prob_ratios[j]=pr;

      decoding[j] = pr<=0;

      for (e = mod2sparse_last_in_col(H,j);
          !mod2sparse_at_end(e);
          e = mod2sparse_prev_in_col(e))
        {
          e->pr = pr-(e->lr);

        }
    }

}